

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void display_object(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  object_kind *kind;
  uint8_t attr;
  object_kind *poVar1;
  uint8_t a;
  _Bool _Var2;
  wchar_t c;
  char *str;
  byte bVar3;
  char o_name [80];
  char local_88 [88];
  
  poVar1 = k_info;
  kind = k_info + oid;
  str = get_autoinscription(kind,k_info[oid].aware);
  if (poVar1[oid].flavor == (flavor *)0x0) {
    bVar3 = 1;
  }
  else {
    bVar3 = kind->aware;
  }
  attr = curs_attrs[bVar3][cursor];
  a = object_kind_attr(kind);
  c = object_kind_char(kind);
  _Var2 = flag_has_dbg(kind->kind_flags,2,4,"kind->kind_flags","KF_INSTA_ART");
  if (!_Var2) {
    object_kind_name(local_88,0x50,kind,(player->opts).opt[0x1a]);
  }
  if (kind->tried == true && bVar3 == 0) {
    my_strcat(local_88," {tried}",0x50);
  }
  c_prt(attr,local_88,row,col);
  if (bVar3 == 0) {
LAB_001d395b:
    _Var2 = kind_is_ignored_unaware(kind);
    if (!_Var2) goto LAB_001d397c;
  }
  else {
    _Var2 = kind_is_ignored_aware(kind);
    if (!_Var2) {
      if (bVar3 != 0) goto LAB_001d397c;
      goto LAB_001d395b;
    }
  }
  c_put_str(attr,"Yes",row,L'.');
LAB_001d397c:
  if (str != (char *)0x0) {
    c_put_str('\v',str,row,L'7');
  }
  if (tile_height == '\x01') {
    big_pad(L'L',row,a,c);
  }
  return;
}

Assistant:

static void display_object(int col, int row, bool cursor, int oid)
{
	struct object_kind *kind = &k_info[oid];
	const char *inscrip = get_autoinscription(kind, kind->aware);

	char o_name[80];

	/* Choose a color */
	bool aware = (!kind->flavor || kind->aware);
	uint8_t attr = curs_attrs[(int)aware][(int)cursor];

	/* Graphics versions of the object_char and object_attr defines */
	uint8_t a = object_kind_attr(kind);
	wchar_t c = object_kind_char(kind);

	/* Don't display special artifacts */
	if (!kf_has(kind->kind_flags, KF_INSTA_ART))
 		object_kind_name(o_name, sizeof(o_name), kind, OPT(player, cheat_xtra));

	/* If the type is "tried", display that */
	if (kind->tried && !aware)
		my_strcat(o_name, " {tried}", sizeof(o_name));

	/* Display the name */
	c_prt(attr, o_name, row, col);

	/* Show ignore status */
	if ((aware && kind_is_ignored_aware(kind)) ||
		(!aware && kind_is_ignored_unaware(kind)))
		c_put_str(attr, "Yes", row, 46);


	/* Show autoinscription if around */
	if (inscrip)
		c_put_str(COLOUR_YELLOW, inscrip, row, 55);

	if (tile_height == 1) {
		big_pad(76, row, a, c);
	}
}